

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::SerialArena::SerialArena(SerialArena *this,Block *b,void *owner)

{
  char *pcVar1;
  void *owner_local;
  Block *b_local;
  SerialArena *this_local;
  
  this->space_used_ = 0;
  std::atomic<unsigned_long>::atomic(&this->space_allocated_,b->size);
  this->owner_ = owner;
  this->head_ = b;
  pcVar1 = Block::Pointer(b,0x50);
  this->ptr_ = pcVar1;
  pcVar1 = Block::Pointer(b,b->size & 0xfffffffffffffff8);
  this->limit_ = pcVar1;
  return;
}

Assistant:

SerialArena::SerialArena(Block* b, void* owner) : space_allocated_(b->size) {
  owner_ = owner;
  head_ = b;
  ptr_ = b->Pointer(kBlockHeaderSize + ThreadSafeArena::kSerialArenaSize);
  limit_ = b->Pointer(b->size & static_cast<size_t>(-8));
}